

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalculateProbability.cc
# Opt level: O3

JointProbabilityState *
discAndCalcJointProbability
          (JointProbabilityState *__return_storage_ptr__,double *firstVector,double *secondVector,
          int vectorLength)

{
  uint *outputVector;
  uint *outputVector_00;
  
  outputVector = (uint *)calloc((long)vectorLength,4);
  outputVector_00 = (uint *)calloc((long)vectorLength,4);
  normaliseArray(firstVector,outputVector,vectorLength);
  normaliseArray(secondVector,outputVector_00,vectorLength);
  calculateJointProbability(__return_storage_ptr__,outputVector,outputVector_00,vectorLength);
  free(outputVector);
  free(outputVector_00);
  return __return_storage_ptr__;
}

Assistant:

JointProbabilityState discAndCalcJointProbability(double *firstVector, double *secondVector, int vectorLength) {
  uint *firstNormalisedVector = (uint *) calloc(vectorLength,sizeof(uint));
  uint *secondNormalisedVector = (uint *) calloc(vectorLength,sizeof(uint));
  JointProbabilityState state;
  
  normaliseArray(firstVector,firstNormalisedVector,vectorLength);
  normaliseArray(secondVector,secondNormalisedVector,vectorLength);

  state = calculateJointProbability(firstNormalisedVector,secondNormalisedVector,vectorLength);

  free(firstNormalisedVector);
  free(secondNormalisedVector);

  return state;
}